

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Input::kf_move_word_left(Fl_Input *this)

{
  int iVar1;
  Fl_Input *this_local;
  
  iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
  iVar1 = Fl_Input_::word_start(&this->super_Fl_Input_,iVar1);
  shift_position(this,iVar1);
  return 1;
}

Assistant:

int Fl_Input::kf_move_word_left() {
  shift_position(word_start(position()));
  return 1; 
}